

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_robertson.c
# Opt level: O0

int Jac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2
       ,N_Vector tmp3)

{
  double dVar1;
  double dVar2;
  long *in_RDX;
  long *in_RDI;
  sunrealtype w;
  sunrealtype v;
  
  dVar1 = *(double *)(*(long *)(*in_RDI + 0x10) + 8);
  dVar2 = *(double *)(*(long *)(*in_RDI + 0x10) + 0x10);
  SUNMatZero(in_RDX);
  *(undefined8 *)**(undefined8 **)(*in_RDX + 0x20) = 0xbfa47ae147ae147b;
  **(double **)(*(long *)(*in_RDX + 0x20) + 8) = dVar2 * 10000.0;
  **(double **)(*(long *)(*in_RDX + 0x20) + 0x10) = dVar1 * 10000.0;
  *(undefined8 *)(**(long **)(*in_RDX + 0x20) + 8) = 0x3fa47ae147ae147b;
  *(double *)(*(long *)(*(long *)(*in_RDX + 0x20) + 8) + 8) =
       dVar2 * -10000.0 + -(dVar1 * 60000000.0);
  *(double *)(*(long *)(*(long *)(*in_RDX + 0x20) + 0x10) + 8) = dVar1 * -10000.0;
  *(double *)(*(long *)(*(long *)(*in_RDX + 0x20) + 8) + 0x10) = dVar1 * 60000000.0;
  return 0;
}

Assistant:

static int Jac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
               void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype v = NV_Ith_S(y, 1); /* access current solution */
  sunrealtype w = NV_Ith_S(y, 2);
  SUNMatZero(J); /* initialize Jacobian to zero */

  /* Fill in the Jacobian of the ODE RHS function */
  SM_ELEMENT_D(J, 0, 0) = -0.04;
  SM_ELEMENT_D(J, 0, 1) = 1.e4 * w;
  SM_ELEMENT_D(J, 0, 2) = 1.e4 * v;

  SM_ELEMENT_D(J, 1, 0) = 0.04;
  SM_ELEMENT_D(J, 1, 1) = -1.e4 * w - 6.e7 * v;
  SM_ELEMENT_D(J, 1, 2) = -1.e4 * v;

  SM_ELEMENT_D(J, 2, 1) = 6.e7 * v;

  return 0; /* Return with success */
}